

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O3

AllocateResult __thiscall
capnp::_::BuilderArena::allocate(BuilderArena *this,SegmentWordCount amount)

{
  ulong uVar1;
  int iVar2;
  word *pwVar3;
  undefined4 extraout_var_00;
  SegmentBuilder *pSVar4;
  word *result;
  ulong extraout_RDX;
  size_t extraout_RDX_00;
  AllocateResult AVar5;
  ArrayPtr<capnp::word> content;
  anon_class_8_1_89918cff local_20;
  undefined4 extraout_var;
  
  uVar1 = (ulong)amount;
  if ((this->segment0).super_SegmentReader.arena == (Arena *)0x0) {
    iVar2 = (*this->message->_vptr_MessageBuilder[2])(this->message,uVar1);
    pwVar3 = (word *)CONCAT44(extraout_var,iVar2);
    if (0x1fffffff < extraout_RDX) {
      anon_func::anon_class_8_1_89918cff::operator()(&local_20);
    }
    pSVar4 = &this->segment0;
    (this->segment0).super_SegmentReader.arena = &this->super_Arena;
    (this->segment0).super_SegmentReader.id.value = 0;
    (this->segment0).super_SegmentReader.ptr.ptr = pwVar3;
    (this->segment0).super_SegmentReader.ptr.size_ = extraout_RDX;
    (this->segment0).super_SegmentReader.readLimiter = &this->dummyLimiter;
    (this->segment0).pos = pwVar3;
    (this->segment0).readOnly = false;
    this->segmentWithSpace = pSVar4;
    if (uVar1 <= extraout_RDX) {
      (this->segment0).pos = pwVar3 + uVar1;
      goto LAB_00404ee5;
    }
  }
  else {
    pSVar4 = this->segmentWithSpace;
    if (((pSVar4 != (SegmentBuilder *)0x0) &&
        (pwVar3 = pSVar4->pos,
        (long)uVar1 <=
        (long)((long)(pSVar4->super_SegmentReader).ptr.ptr +
              ((pSVar4->super_SegmentReader).ptr.size_ * 8 - (long)pwVar3)) >> 3)) &&
       (pSVar4->pos = pwVar3 + uVar1, pwVar3 != (word *)0x0)) {
      pSVar4 = this->segmentWithSpace;
      goto LAB_00404ee5;
    }
    iVar2 = (*this->message->_vptr_MessageBuilder[2])(this->message,uVar1);
    content.ptr._4_4_ = extraout_var_00;
    content.ptr._0_4_ = iVar2;
    content.size_ = extraout_RDX_00;
    pSVar4 = addSegmentInternal<capnp::word>(this,content);
    this->segmentWithSpace = pSVar4;
    pwVar3 = pSVar4->pos;
    if ((long)uVar1 <=
        (long)((long)(pSVar4->super_SegmentReader).ptr.ptr +
              ((pSVar4->super_SegmentReader).ptr.size_ * 8 - (long)pwVar3)) >> 3) {
      pSVar4->pos = pwVar3 + uVar1;
      goto LAB_00404ee5;
    }
  }
  pwVar3 = (word *)0x0;
LAB_00404ee5:
  AVar5.words = pwVar3;
  AVar5.segment = pSVar4;
  return AVar5;
}

Assistant:

BuilderArena::AllocateResult BuilderArena::allocate(SegmentWordCount amount) {
  if (segment0.getArena() == nullptr) {
    // We're allocating the first segment.
    kj::ArrayPtr<word> ptr = message->allocateSegment(unbound(amount / WORDS));
    auto actualSize = verifySegmentSize(ptr.size());

    // Re-allocate segment0 in-place.  This is a bit of a hack, but we have not returned any
    // pointers to this segment yet, so it should be fine.
    kj::dtor(segment0);
    kj::ctor(segment0, this, SegmentId(0), ptr.begin(), actualSize, &this->dummyLimiter);

    segmentWithSpace = &segment0;
    return AllocateResult { &segment0, segment0.allocate(amount) };
  } else {
    if (segmentWithSpace != nullptr) {
      // Check if there is space in an existing segment.
      // TODO(perf):  Check for available space in more than just the last segment.  We don't
      //   want this to be O(n), though, so we'll need to maintain some sort of table.  Complicating
      //   matters, we want SegmentBuilders::allocate() to be fast, so we can't update any such
      //   table when allocation actually happens.  Instead, we could have a priority queue based
      //   on the last-known available size, and then re-check the size when we pop segments off it
      //   and shove them to the back of the queue if they have become too small.
      word* attempt = segmentWithSpace->allocate(amount);
      if (attempt != nullptr) {
        return AllocateResult { segmentWithSpace, attempt };
      }
    }

    // Need to allocate a new segment.
    SegmentBuilder* result = addSegmentInternal(message->allocateSegment(unbound(amount / WORDS)));

    // Check this new segment first the next time we need to allocate.
    segmentWithSpace = result;

    // Allocating from the new segment is guaranteed to succeed since we made it big enough.
    return AllocateResult { result, result->allocate(amount) };
  }
}